

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gsl.hpp
# Opt level: O2

reference __thiscall
pstore::gsl::details::span_iterator<pstore::gsl::span<int,_3L>,_false>::operator*
          (span_iterator<pstore::gsl::span<int,_3L>,_false> *this)

{
  reference peVar1;
  
  if (this->span_ != (span<int,_3L> *)0x0) {
    peVar1 = span<int,_3L>::operator[](this->span_,this->index_);
    return peVar1;
  }
  assert_failed("span_",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/support/gsl.hpp"
                ,0x6f);
}

Assistant:

reference operator* () const {
                    PSTORE_ASSERT (span_);
                    return (*span_)[index_];
                }